

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeadModel.cpp
# Opt level: O1

void __thiscall OpenMD::BeadModel::checkElement(BeadModel *this,size_t i)

{
  RealType *pRVar1;
  pointer pHVar2;
  
  pRVar1 = &(this->super_ApproximateModel).elements_.
            super__Vector_base<OpenMD::HydrodynamicsElement,_std::allocator<OpenMD::HydrodynamicsElement>_>
            ._M_impl.super__Vector_impl_data._M_start[i].radius;
  if (*pRVar1 <= 0.0 && *pRVar1 != 0.0) {
    snprintf(painCave.errMsg,2000,
             "BeadModel::checkElement: There is a bead with a negative radius.\n\tStarting from index 0, check bead (%zu).\n"
             ,i);
    painCave.isFatal = 1;
    simError();
  }
  pHVar2 = (this->super_ApproximateModel).elements_.
           super__Vector_base<OpenMD::HydrodynamicsElement,_std::allocator<OpenMD::HydrodynamicsElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = &pHVar2[i].radius;
  if (*pRVar1 <= 1e-14 && *pRVar1 != 1e-14) {
    pHVar2[i].radius = 1e-14;
  }
  return;
}

Assistant:

void BeadModel::checkElement(std::size_t i) {
    // checking if the radius is a non-negative value.
    if (elements_[i].radius < 0) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "BeadModel::checkElement: There is a bead with a negative radius.\n"
          "\tStarting from index 0, check bead (%zu).\n",
          i);
      painCave.isFatal = 1;
      simError();
    }
    // if the bead's radius is below 1.0e-14, substitute by 1.0e-14;
    // to avoid problem in the self-interaction part (i.e., to not divide by
    // zero)
    if (elements_[i].radius < 1.0e-14) elements_[i].radius = 1.0e-14;
  }